

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall google::protobuf::internal::DynamicMapField::~DynamicMapField(DynamicMapField *this)

{
  bool bVar1;
  undefined8 *in_RDI;
  MapValueRef *unaff_retaddr;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_00000010;
  iterator iter;
  iterator *in_stack_ffffffffffffffa8;
  pointer in_stack_ffffffffffffffb0;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_ffffffffffffffd0;
  
  *in_RDI = &PTR__DynamicMapField_00961198;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin(in_stack_ffffffffffffffd0);
  while( true ) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end(in_stack_ffffffffffffffd0);
    bVar1 = protobuf::operator!=((iterator *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    in_stack_ffffffffffffffb0 =
         Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
                   ((iterator *)0x43076d);
    MapValueRef::DeleteData(unaff_retaddr);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator++
              ((iterator *)in_stack_ffffffffffffffb0);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(in_stack_00000010);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::~Map
            ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
             in_stack_ffffffffffffffb0);
  TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
  ~TypeDefinedMapFieldBase
            ((TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
             0x4307bc);
  return;
}

Assistant:

DynamicMapField::~DynamicMapField() {
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  for (Map<MapKey, MapValueRef>::iterator iter = map_.begin();
       iter != map_.end(); ++iter) {
    iter->second.DeleteData();
  }
  map_.clear();
}